

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::CoverpointSymbol::visitExprs<slang::ast::CheckerMemberVisitor&>
          (CoverpointSymbol *this,CheckerMemberVisitor *visitor)

{
  Expression *pEVar1;
  long lVar2;
  CoverageOptionSetter *opt;
  pointer this_00;
  
  pEVar1 = DeclaredType::getInitializer(&this->declaredType);
  if (pEVar1 != (Expression *)0x0) {
    Expression::visit<slang::ast::CheckerMemberVisitor&>(pEVar1,visitor);
  }
  pEVar1 = getIffExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    Expression::visit<slang::ast::CheckerMemberVisitor&>(pEVar1,visitor);
  }
  this_00 = (this->options)._M_ptr;
  for (lVar2 = (this->options)._M_extent._M_extent_value * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18)
  {
    CoverageOptionSetter::visitExprs<slang::ast::CheckerMemberVisitor&>(this_00,visitor);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (auto expr = declaredType.getInitializer())
            expr->visit(visitor);

        if (auto expr = getIffExpr())
            expr->visit(visitor);

        for (auto& opt : options)
            opt.visitExprs(visitor);
    }